

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
MultiBodyInplaceSolverIslandCallback::processIsland
          (MultiBodyInplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  btTypedConstraint *pbVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  btTypedConstraint **_Val;
  bool bVar7;
  undefined8 in_stack_ffffffffffffff88;
  btCollisionObject **local_58;
  btPersistentManifold **local_48;
  btMultiBodyConstraint **local_40;
  
  if (islandId < 0) {
    (*(this->m_solver->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
      _vptr_btConstraintSolver[0xd])();
  }
  else {
    uVar6 = this->m_numConstraints;
    uVar3 = 0;
    if (0 < (int)uVar6) {
      uVar3 = (ulong)uVar6;
    }
    _Val = this->m_sortedConstraints;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = ((*_Val)->m_rbA->super_btCollisionObject).m_islandTag1;
      if (iVar2 < 0) {
        iVar2 = ((*_Val)->m_rbB->super_btCollisionObject).m_islandTag1;
      }
      if (iVar2 == islandId) goto LAB_00191491;
      _Val = _Val + 1;
    }
    _Val = (btTypedConstraint **)0x0;
    uVar5 = uVar3;
LAB_00191491:
    uVar4 = 0;
    for (; (long)uVar5 < (long)(int)uVar6; uVar5 = uVar5 + 1) {
      pbVar1 = this->m_sortedConstraints[uVar5];
      iVar2 = (pbVar1->m_rbA->super_btCollisionObject).m_islandTag1;
      if (iVar2 < 0) {
        iVar2 = (pbVar1->m_rbB->super_btCollisionObject).m_islandTag1;
      }
      uVar4 = uVar4 + (iVar2 == islandId);
    }
    local_40 = (btMultiBodyConstraint **)0x0;
    for (uVar3 = 0; (long)uVar3 < (long)this->m_numMultiBodyConstraints; uVar3 = uVar3 + 1) {
      iVar2 = btGetMultiBodyConstraintIslandId(this->m_multiBodySortedConstraints[uVar3]);
      if (iVar2 == islandId) {
        local_40 = this->m_multiBodySortedConstraints + uVar3;
        break;
      }
    }
    uVar6 = 0;
    for (uVar3 = uVar3 & 0xffffffff; (long)uVar3 < (long)this->m_numMultiBodyConstraints;
        uVar3 = uVar3 + 1) {
      iVar2 = btGetMultiBodyConstraintIslandId(this->m_multiBodySortedConstraints[uVar3]);
      uVar6 = uVar6 + (iVar2 == islandId);
    }
    if ((this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize < 2) {
      (*(this->m_solver->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
        _vptr_btConstraintSolver[3])
                (this->m_solver,bodies,(ulong)(uint)numBodies,manifolds,(ulong)(uint)numManifolds,
                 _Val,CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),uVar4),
                 this->m_solverInfo,this->m_debugDrawer,this->m_dispatcher);
    }
    else {
      uVar3 = 0;
      local_58 = bodies;
      if (0 < numBodies) {
        uVar3 = (ulong)(uint)numBodies;
      }
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        btAlignedObjectArray<btCollisionObject_*>::push_back(&this->m_bodies,local_58);
        local_58 = local_58 + 1;
      }
      uVar3 = 0;
      local_48 = manifolds;
      if (0 < numManifolds) {
        uVar3 = (ulong)(uint)numManifolds;
      }
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        btAlignedObjectArray<btPersistentManifold_*>::push_back(&this->m_manifolds,local_48);
        local_48 = local_48 + 1;
      }
      uVar3 = (ulong)uVar4;
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        btAlignedObjectArray<btTypedConstraint_*>::push_back(&this->m_constraints,_Val);
        _Val = _Val + 1;
      }
      uVar3 = (ulong)uVar6;
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        btAlignedObjectArray<btMultiBodyConstraint_*>::push_back
                  (&this->m_multiBodyConstraints,local_40);
        local_40 = local_40 + 1;
      }
      if ((this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize <
          (this->m_manifolds).m_size + (this->m_constraints).m_size) {
        processConstraints(this);
        return;
      }
    }
  }
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveMultiBodyGroup( bodies,numBodies,manifolds, numManifolds,m_sortedConstraints, m_numConstraints, &m_multiBodySortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			btMultiBodyConstraint** startMultiBodyConstraint = 0;

			int numCurConstraints = 0;
			int numCurMultiBodyConstraints = 0;

			int i;
			
			//find the first constraint for this island

			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			for (i=0;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					
					startMultiBodyConstraint = &m_multiBodySortedConstraints[i];
					break;
				}
			}
			//count the number of multi body constraints in this island
			for (;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					numCurMultiBodyConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{
				
				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				
				for (i=0;i<numCurMultiBodyConstraints;i++)
					m_multiBodyConstraints.push_back(startMultiBodyConstraint[i]);
				
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}